

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlers.cpp
# Opt level: O0

bool Handlers::packet_handler_register::StateCheck(EOClient *client,unsigned_short allow_states)

{
  unsigned_short allow_states_local;
  EOClient *client_local;
  
  switch(client->state) {
  case Uninitialized:
    if ((allow_states & 1) != 0) {
      return true;
    }
    break;
  case Initialized:
    if ((allow_states & 2) != 0) {
      return true;
    }
    break;
  case LoggedIn:
    if (client->player->character == (Character *)0x0) {
      if ((allow_states & 4) != 0) {
        return true;
      }
    }
    else if ((allow_states & 8) != 0) {
      return true;
    }
    break;
  case Playing:
    if ((allow_states & 0x10) != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool packet_handler_register::StateCheck(EOClient *client, unsigned short allow_states)
{
	switch (client->state)
	{
		case EOClient::Uninitialized:
			if (allow_states & Uninitialized)
				return true;

			break;

		case EOClient::Initialized:
			if (allow_states & Menu)
				return true;

			break;

		case EOClient::LoggedIn:
			if (client->player->character)
			{
				if (allow_states & Logging_In)
					return true;
			}
			else
			{
				if (allow_states & Character_Menu)
					return true;
			}

			break;

		case EOClient::Playing:
			if (allow_states & Playing)
				return true;

			break;
	};

	return false;
}